

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::write_obj_id_selfref(CTcDataStream *this,CTcSymObj *obj_sym)

{
  CTcSymObjBase::add_self_ref_fixup(&obj_sym->super_CTcSymObjBase,this,this->ofs_);
  write4(this,(obj_sym->super_CTcSymObjBase).obj_id_);
  return;
}

Assistant:

void CTcDataStream::write_obj_id_selfref(CTcSymObj *obj_sym)
{
    /* 
     *   Add a fixup list entry to the symbol.  This type of reference
     *   must be kept with the symbol rather than in the global list,
     *   because we must apply this type of fixup each time we renumber
     *   the symbol. 
     */
    obj_sym->add_self_ref_fixup(this, get_ofs());

    /* write the ID to the stream */
    write4(obj_sym->get_obj_id());
}